

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyLG.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<12>::TransitionProbabilities::verifyLG(int LG)

{
  undefined8 *puVar1;
  
  if (0xfffffffd < LG - 3U) {
    return;
  }
  tools::Log::error<char_const*>("Encountered illegal LG value");
  tools::Log::info<char_const*>("LG must be equal to 1 (simple case) or 2 (complex case)");
  tools::Log::info<char_const*,int>("LG value: {}",LG);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyLG( int LG ) {

  if ( ( LG != 1 ) and ( LG != 2 ) ) {

    Log::error( "Encountered illegal LG value" );
    Log::info( "LG must be equal to 1 (simple case) or 2 (complex case)" );
    Log::info( "LG value: {}", LG );
    throw std::exception();
  }
}